

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void __thiscall HighsHashTable<int,_unsigned_int>::clear(HighsHashTable<int,_unsigned_int> *this)

{
  pointer __s;
  long in_RDI;
  u64 capacity;
  
  if (*(long *)(in_RDI + 0x20) != 0) {
    if (*(long *)(in_RDI + 0x10) == 0x7f) {
      __s = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                      ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)0x80);
      memset(__s,0,0x80);
      *(undefined8 *)(in_RDI + 0x20) = 0;
    }
    else {
      makeEmptyTable(this,capacity);
    }
  }
  return;
}

Assistant:

void clear() {
    if (numElements) {
      u64 capacity = tableSizeMask + 1;
      if (!std::is_trivially_destructible<Entry>::value) {
        for (u64 i = 0; i < capacity; ++i)
          if (occupied(metadata[i])) entries.get()[i].~Entry();
      }
      if (capacity == 128) {
        std::memset(metadata.get(), 0, 128);
        numElements = 0;
      } else
        makeEmptyTable(128);
    }
  }